

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void MetaConst(nodemeta *i,void *Data)

{
  uint uVar1;
  size_t __n;
  ulong __n_00;
  
  uVar1 = *(uint *)i;
  if ((0x20421e08642U >> (ulong)(uVar1 & 0x3f) & 1) == 0) {
    __n_00 = (ulong)ParamSize[uVar1 & 0x3f];
    memset((void *)((ulong)(uVar1 >> 8) + (long)Data),0,__n_00);
    __n = 8;
    if (__n_00 < 8) {
      __n = __n_00;
    }
    memcpy((void *)((ulong)(*(uint *)i >> 8) + (long)Data),&i->Data,__n);
    return;
  }
  *(uintptr_t *)((long)Data + (ulong)(uVar1 >> 8)) = i->Data;
  return;
}

Assistant:

static void MetaConst(const nodemeta* i,void* Data)
{
    size_t Size = ParamSize[i->Meta & TYPE_MASK];
    if (Size == sizeof(uintptr_t))
        memcpy((uint8_t*)Data+i->Id,&i->Data,sizeof(uintptr_t));
    else
    {
        memset((uint8_t*)Data+i->Id,0,Size);
        memcpy((uint8_t*)Data+i->Id,&i->Data,MIN(sizeof(uintptr_t),Size));
    }
}